

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3UpdateDocTotals(int *pRC,Fts3Table *p,u32 *aSzIns,u32 *aSzDel,int nChng)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  sqlite3_stmt *pStmt_00;
  void *pvVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  uint *p_00;
  Mem *pVal;
  long lVar8;
  uint uVar9;
  uint uVar10;
  size_t __n;
  byte *pbVar11;
  uint *__s;
  ulong uVar12;
  undefined4 in_register_00000084;
  uint nData;
  ulong uVar13;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_78;
  int local_6c;
  long local_68;
  uint *local_60;
  u32 *local_58;
  void *local_50;
  ulong local_48;
  undefined8 local_40;
  uint local_38 [2];
  
  local_40 = CONCAT44(in_register_00000084,nChng);
  if (*pRC != 0) {
    return;
  }
  iVar7 = p->nColumn;
  iVar6 = sqlite3_initialize();
  if (iVar6 != 0) {
LAB_001c17a7:
    *pRC = 7;
    return;
  }
  uVar1 = (long)iVar7 + 2;
  p_00 = (uint *)sqlite3Malloc(uVar1 * 0xe);
  if (p_00 == (uint *)0x0) goto LAB_001c17a7;
  local_68 = (long)iVar7;
  iVar7 = fts3SqlStmt(p,0x16,&local_78,(sqlite3_value **)0x0);
  pStmt_00 = local_78;
  if (iVar7 != 0) goto LAB_001c1936;
  uVar13 = 0;
  sqlite3_bind_int64(local_78,1,0);
  iVar7 = sqlite3_step(pStmt_00);
  if (iVar7 == 100) {
    pVal = columnMem(pStmt_00,0);
    local_50 = sqlite3_value_blob(pVal);
    columnMallocFailure(pStmt_00);
    iVar7 = sqlite3_column_bytes(pStmt_00,0);
    pvVar4 = local_50;
    if (((iVar7 != 0) && (-1 < *(char *)((long)local_50 + (long)iVar7 + -1))) &&
       (0 < iVar7 && -2 < (int)local_68)) {
      local_48 = uVar1 & 0xffffffff;
      uVar13 = 0;
      iVar6 = 0;
      local_6c = iVar7;
      local_60 = p_00;
      local_58 = aSzDel;
      do {
        iVar7 = sqlite3Fts3GetVarint((char *)((long)iVar6 + (long)pvVar4),(sqlite_int64 *)local_38);
        local_60[uVar13] = local_38[0];
        uVar13 = uVar13 + 1;
        p_00 = local_60;
        aSzDel = local_58;
        if (local_48 <= uVar13) break;
        iVar6 = iVar6 + iVar7;
      } while (iVar6 < local_6c);
    }
    if ((int)(uint)uVar13 < (int)uVar1) {
      __n = (ulong)(~(uint)uVar13 + (int)uVar1) * 4 + 4;
      __s = p_00 + (uVar13 & 0xffffffff);
      goto LAB_001c1922;
    }
  }
  else {
    __n = uVar1 * 4;
    __s = p_00;
LAB_001c1922:
    memset(__s,0,__n);
  }
  iVar7 = sqlite3_reset(pStmt_00);
  if (iVar7 == 0) {
    iVar7 = (int)local_40;
    uVar10 = *p_00 + iVar7;
    nData = 0;
    uVar9 = uVar10;
    if (*p_00 < (uint)-iVar7) {
      uVar9 = nData;
    }
    if (-1 < iVar7) {
      uVar9 = uVar10;
    }
    *p_00 = uVar9;
    if (-1 < p->nColumn) {
      lVar8 = -1;
      do {
        uVar9 = (aSzIns[lVar8 + 1] + p_00[lVar8 + 2]) - aSzDel[lVar8 + 1];
        if (aSzIns[lVar8 + 1] + p_00[lVar8 + 2] < aSzDel[lVar8 + 1]) {
          uVar9 = 0;
        }
        p_00[lVar8 + 2] = uVar9;
        lVar8 = lVar8 + 1;
      } while (lVar8 < p->nColumn);
    }
    if (-2 < (int)local_68) {
      uVar13 = 0;
      nData = 0;
      do {
        pbVar5 = (byte *)((long)(int)nData + (long)(p_00 + uVar1));
        uVar12 = (ulong)p_00[uVar13];
        do {
          pbVar11 = pbVar5;
          bVar3 = (byte)uVar12;
          *pbVar11 = bVar3 | 0x80;
          nData = nData + 1;
          bVar2 = 0x7f < uVar12;
          pbVar5 = pbVar11 + 1;
          uVar12 = uVar12 >> 7;
        } while (bVar2);
        *pbVar11 = bVar3;
        uVar13 = uVar13 + 1;
      } while (uVar13 != (uVar1 & 0xffffffff));
    }
    iVar7 = fts3SqlStmt(p,0x17,&local_78,(sqlite3_value **)0x0);
    if (iVar7 != 0) {
      sqlite3_free(p_00);
      *pRC = iVar7;
      return;
    }
    sqlite3_bind_int64(local_78,1,0);
    bindText(local_78,2,p_00 + uVar1,nData,(_func_void_void_ptr *)0x0,'\0');
    sqlite3_step(local_78);
    iVar7 = sqlite3_reset(local_78);
    *pRC = iVar7;
    sqlite3_bind_null(local_78,2);
    sqlite3_free(p_00);
    return;
  }
LAB_001c1936:
  sqlite3_free(p_00);
  *pRC = iVar7;
  return;
}

Assistant:

static void fts3UpdateDocTotals(
  int *pRC,                       /* The result code */
  Fts3Table *p,                   /* Table being updated */
  u32 *aSzIns,                    /* Size increases */
  u32 *aSzDel,                    /* Size decreases */
  int nChng                       /* Change in the number of documents */
){
  char *pBlob;             /* Storage for BLOB written into %_stat */
  int nBlob;               /* Size of BLOB written into %_stat */
  u32 *a;                  /* Array of integers that becomes the BLOB */
  sqlite3_stmt *pStmt;     /* Statement for reading and writing */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subfunctions */

  const int nStat = p->nColumn+2;

  if( *pRC ) return;
  a = sqlite3_malloc64( (sizeof(u32)+10)*(sqlite3_int64)nStat );
  if( a==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  pBlob = (char*)&a[nStat];
  rc = fts3SqlStmt(p, SQL_SELECT_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  if( sqlite3_step(pStmt)==SQLITE_ROW ){
    fts3DecodeIntArray(nStat, a,
         sqlite3_column_blob(pStmt, 0),
         sqlite3_column_bytes(pStmt, 0));
  }else{
    memset(a, 0, sizeof(u32)*(nStat) );
  }
  rc = sqlite3_reset(pStmt);
  if( rc!=SQLITE_OK ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  if( nChng<0 && a[0]<(u32)(-nChng) ){
    a[0] = 0;
  }else{
    a[0] += nChng;
  }
  for(i=0; i<p->nColumn+1; i++){
    u32 x = a[i+1];
    if( x+aSzIns[i] < aSzDel[i] ){
      x = 0;
    }else{
      x = x + aSzIns[i] - aSzDel[i];
    }
    a[i+1] = x;
  }
  fts3EncodeIntArray(nStat, a, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, SQLITE_STATIC);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
  sqlite3_bind_null(pStmt, 2);
  sqlite3_free(a);
}